

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVStreambuf.h
# Opt level: O0

void __thiscall
cmBasicUVStreambuf<char,_std::char_traits<char>_>::HandleAlloc
          (cmBasicUVStreambuf<char,_std::char_traits<char>_> *this,uv_buf_t *buf)

{
  char *pcVar1;
  void *__src;
  long lVar2;
  long lVar3;
  char *pcVar4;
  size_type sVar5;
  long size;
  uv_buf_t *buf_local;
  cmBasicUVStreambuf<char,_std::char_traits<char>_> *this_local;
  
  std::streambuf::egptr();
  std::streambuf::gptr();
  pcVar1 = std::vector<char,_std::allocator<char>_>::data(&this->InputBuffer);
  __src = (void *)std::streambuf::gptr();
  lVar2 = std::streambuf::egptr();
  lVar3 = std::streambuf::gptr();
  memmove(pcVar1,__src,lVar2 - lVar3);
  pcVar1 = std::vector<char,_std::allocator<char>_>::data(&this->InputBuffer);
  pcVar4 = std::vector<char,_std::allocator<char>_>::data(&this->InputBuffer);
  std::vector<char,_std::allocator<char>_>::data(&this->InputBuffer);
  std::streambuf::setg((char *)this,pcVar1,pcVar4);
  pcVar1 = (char *)std::streambuf::egptr();
  buf->base = pcVar1;
  pcVar1 = std::vector<char,_std::allocator<char>_>::data(&this->InputBuffer);
  sVar5 = std::vector<char,_std::allocator<char>_>::size(&this->InputBuffer);
  lVar2 = std::streambuf::egptr();
  buf->len = (size_t)(pcVar1 + (sVar5 - lVar2));
  return;
}

Assistant:

void cmBasicUVStreambuf<CharT, Traits>::HandleAlloc(uv_buf_t* buf)
{
  auto size = this->egptr() - this->gptr();
  std::memmove(this->InputBuffer.data(), this->gptr(),
               this->egptr() - this->gptr());
  this->setg(this->InputBuffer.data(), this->InputBuffer.data(),
             this->InputBuffer.data() + size);
  buf->base = this->egptr();
#ifdef _WIN32
#  define BUF_LEN_TYPE ULONG
#else
#  define BUF_LEN_TYPE size_t
#endif
  buf->len = BUF_LEN_TYPE(
    (this->InputBuffer.data() + this->InputBuffer.size() - this->egptr()) *
    sizeof(CharT));
#undef BUF_LEN_TYPE
}